

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::kotlin::FieldGenerator::GenerateStringField
          (FieldGenerator *this,Printer *printer)

{
  Printer *printer_00;
  FieldDescriptor *pFVar1;
  initializer_list<google::protobuf::io::Printer::Sub> v;
  undefined8 uVar2;
  bool bVar3;
  Options *pOVar4;
  undefined1 in_R8B;
  Sub *local_3b0;
  string_view local_368;
  Options local_358;
  string_view local_308;
  Options local_2f8;
  basic_string_view<char,_std::char_traits<char>_> local_2a0;
  undefined1 local_289;
  anon_class_8_1_55a613f1_for_cb local_288;
  allocator<char> local_279;
  string local_278;
  anon_class_8_1_55a613f1_for_cb local_258;
  allocator<char> local_249;
  string local_248;
  Sub *local_228;
  Sub local_220;
  Sub local_168;
  iterator local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_a0 [2];
  undefined1 local_80 [88];
  JvmNameContext name_ctx;
  Printer *printer_local;
  FieldGenerator *this_local;
  
  name_ctx._16_8_ = printer;
  bVar3 = FieldDescriptor::is_repeated(this->descriptor_);
  if (bVar3) {
    GenerateRepeatedStringField(this,(Printer *)name_ctx._16_8_);
  }
  else {
    local_80._80_8_ = java::Context::options(this->context_);
    uVar2 = name_ctx._16_8_;
    name_ctx.options = (Options *)name_ctx._16_8_;
    name_ctx.printer._0_1_ = this->lite_ & 1;
    printer_00 = (Printer *)this->descriptor_;
    pOVar4 = java::Context::options(this->context_);
    java::Options::Options((Options *)local_80,pOVar4);
    java::WriteFieldDocComment
              ((java *)uVar2,printer_00,(FieldDescriptor *)local_80,(Options *)0x1,(bool)in_R8B);
    java::Options::~Options((Options *)local_80);
    uVar2 = name_ctx._16_8_;
    local_289 = 1;
    local_228 = &local_220;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_248,"jvm_name_get",&local_249);
    local_258.name_ctx = (JvmNameContext *)(local_80 + 0x50);
    io::Printer::Sub::
    Sub<google::protobuf::compiler::kotlin::FieldGenerator::GenerateStringField(google::protobuf::io::Printer*)const::__0>
              (&local_220,&local_248,&local_258);
    local_228 = &local_168;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,"jvm_name_set",&local_279);
    local_288.name_ctx = (JvmNameContext *)(local_80 + 0x50);
    io::Printer::Sub::
    Sub<google::protobuf::compiler::kotlin::FieldGenerator::GenerateStringField(google::protobuf::io::Printer*)const::__1>
              (&local_168,&local_278,&local_288);
    local_289 = 0;
    local_b0 = &local_220;
    local_a8 = 2;
    v._M_len = 2;
    v._M_array = local_b0;
    absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
    Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
              ((Span<google::protobuf::io::Printer::Sub_const> *)local_a0[0]._M_local_buf,v);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_2a0,
               "$kt_deprecation$public var $kt_name$: kotlin.String\n  $jvm_name_get$  get() = $kt_dsl_builder$.${$$kt_safe_name$$}$\n  $jvm_name_set$  set(value) {\n    $kt_dsl_builder$.${$$kt_safe_name$$}$ = value\n  }\n"
              );
    io::Printer::SourceLocation::current();
    io::Printer::Emit((Printer *)uVar2,local_a0[0]._M_allocated_capacity,local_a0[0]._8_8_,
                      local_2a0._M_len);
    local_3b0 = (Sub *)&local_b0;
    do {
      local_3b0 = local_3b0 + -1;
      io::Printer::Sub::~Sub(local_3b0);
    } while (local_3b0 != &local_220);
    std::__cxx11::string::~string((string *)&local_278);
    std::allocator<char>::~allocator(&local_279);
    std::__cxx11::string::~string((string *)&local_248);
    std::allocator<char>::~allocator(&local_249);
    uVar2 = name_ctx._16_8_;
    pFVar1 = this->descriptor_;
    pOVar4 = java::Context::options(this->context_);
    java::Options::Options(&local_2f8,pOVar4);
    java::WriteFieldAccessorDocComment((Printer *)uVar2,pFVar1,CLEARER,&local_2f8,false,true,false);
    java::Options::~Options(&local_2f8);
    uVar2 = name_ctx._16_8_;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_308,
               "public fun ${$clear$kt_capitalized_name$$}$() {\n  $kt_dsl_builder$.${$clear$capitalized_name$$}$()\n}\n"
              );
    io::Printer::Print<>((Printer *)uVar2,local_308);
    bVar3 = FieldDescriptor::has_presence(this->descriptor_);
    uVar2 = name_ctx._16_8_;
    if (bVar3) {
      pFVar1 = this->descriptor_;
      pOVar4 = java::Context::options(this->context_);
      java::Options::Options(&local_358,pOVar4);
      java::WriteFieldAccessorDocComment((Printer *)uVar2,pFVar1,HAZZER,&local_358,false,true,false)
      ;
      java::Options::~Options(&local_358);
      uVar2 = name_ctx._16_8_;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_368,
                 "public fun ${$has$kt_capitalized_name$$}$(): kotlin.Boolean {\n  return $kt_dsl_builder$.${$has$capitalized_name$$}$()\n}\n"
                );
      io::Printer::Print<>((Printer *)uVar2,local_368);
    }
  }
  return;
}

Assistant:

void FieldGenerator::GenerateStringField(io::Printer* printer) const {
  if (descriptor_->is_repeated()) {
    GenerateRepeatedStringField(printer);
    return;
  }
  java::JvmNameContext name_ctx = {context_->options(), printer, lite_};
  WriteFieldDocComment(printer, descriptor_, context_->options(),
                       /* kdoc */ true);
  printer->Emit(
      {
          {"jvm_name_get",
           [&] { JvmName("${$get$kt_capitalized_name$$}$", name_ctx); }},
          {"jvm_name_set",
           [&] { JvmName("${$set$kt_capitalized_name$$}$", name_ctx); }},
      },
      "$kt_deprecation$public var $kt_name$: kotlin.String\n"
      "  $jvm_name_get$"
      "  get() = $kt_dsl_builder$.${$$kt_safe_name$$}$\n"
      "  $jvm_name_set$"
      "  set(value) {\n"
      "    $kt_dsl_builder$.${$$kt_safe_name$$}$ = value\n"
      "  }\n");

  WriteFieldAccessorDocComment(printer, descriptor_, java::CLEARER,
                               context_->options(), /* builder */ false,
                               /* kdoc */ true);
  printer->Print(
      "public fun ${$clear$kt_capitalized_name$$}$() {\n"
      "  $kt_dsl_builder$.${$clear$capitalized_name$$}$()\n"
      "}\n");

  if (descriptor_->has_presence()) {
    WriteFieldAccessorDocComment(printer, descriptor_, java::HAZZER,
                                 context_->options(), /* builder */ false,
                                 /* kdoc */ true);
    printer->Print(
        "public fun ${$has$kt_capitalized_name$$}$(): kotlin.Boolean {\n"
        "  return $kt_dsl_builder$.${$has$capitalized_name$$}$()\n"
        "}\n");
  }
}